

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weapon.c
# Opt level: O0

int hitval(obj *otmp,monst *mon)

{
  permonst *ppVar1;
  boolean bVar2;
  int iVar3;
  char *pcVar4;
  bool bVar5;
  boolean Is_weapon;
  permonst *ptr;
  int tmp;
  monst *mon_local;
  obj *otmp_local;
  
  ptr._4_4_ = 0;
  ppVar1 = mon->data;
  if (otmp == (obj *)0x0) {
    otmp_local._4_4_ = 0;
  }
  else {
    bVar5 = true;
    if ((otmp->oclass != '\x02') && (bVar5 = false, otmp->oclass == '\x06')) {
      bVar5 = objects[otmp->otyp].oc_subtyp != '\0';
    }
    if (bVar5) {
      ptr._4_4_ = (int)otmp->spe;
    }
    ptr._4_4_ = objects[otmp->otyp].oc_oc1 + ptr._4_4_;
    if (((bVar5) && ((*(uint *)&otmp->field_0x4a >> 1 & 1) != 0)) &&
       (((ppVar1->mflags2 & 0x200) != 0 || ((ppVar1->mflags2 & 2) != 0)))) {
      ptr._4_4_ = ptr._4_4_ + 2;
    }
    if ((((otmp->oclass == '\x02') && ('\x11' < objects[otmp->otyp].oc_subtyp)) &&
        (objects[otmp->otyp].oc_subtyp < '\x14')) &&
       (pcVar4 = strchr("2\x1e$(\"",(int)ppVar1->mlet), pcVar4 != (char *)0x0)) {
      ptr._4_4_ = ptr._4_4_ + 2;
    }
    if ((otmp->otyp == 0x10) && ((ppVar1->mflags1 & 2) != 0)) {
      bVar2 = is_pool(level,(int)mon->mx,(int)mon->my);
      if (bVar2 == '\0') {
        if ((ppVar1->mlet == '9') || (ppVar1->mlet == '-')) {
          ptr._4_4_ = ptr._4_4_ + 2;
        }
      }
      else {
        ptr._4_4_ = ptr._4_4_ + 4;
      }
    }
    if ((((otmp->oclass == '\x02') || (otmp->oclass == '\x06')) &&
        (objects[otmp->otyp].oc_subtyp == '\x04')) &&
       (((ppVar1->mflags1 & 8) != 0 && ((ppVar1->mflags1 & 0x200000) != 0)))) {
      ptr._4_4_ = ptr._4_4_ + 2;
    }
    if (otmp->oartifact != '\0') {
      iVar3 = spec_abon(otmp,mon);
      ptr._4_4_ = iVar3 + ptr._4_4_;
    }
    otmp_local._4_4_ = ptr._4_4_;
  }
  return otmp_local._4_4_;
}

Assistant:

int hitval(struct obj *otmp, struct monst *mon)
{
	int	tmp = 0;
	const struct permonst *ptr = mon->data;
	boolean Is_weapon = FALSE;

	/* not using a weapon; no special bonuses */
	if (!otmp) return 0;

	Is_weapon = (otmp->oclass == WEAPON_CLASS || is_weptool(otmp));

	if (Is_weapon)
		tmp += otmp->spe;

/*	Put weapon specific "to hit" bonuses in below:		*/
	tmp += objects[otmp->otyp].oc_hitbon;

/*	Put weapon vs. monster type "to hit" bonuses in below:	*/

	/* Blessed weapons used against undead or demons */
	if (Is_weapon && otmp->blessed &&
	   (is_demon(ptr) || is_undead(ptr))) tmp += 2;

	if (is_spear(otmp) &&
	   strchr(kebabable, ptr->mlet)) tmp += 2;

	/* trident is highly effective against swimmers */
	if (otmp->otyp == TRIDENT && is_swimmer(ptr)) {
	   if (is_pool(level, mon->mx, mon->my)) tmp += 4;
	   else if (ptr->mlet == S_EEL || ptr->mlet == S_SNAKE) tmp += 2;
	}

	/* Picks used against xorns and earth elementals */
	if (is_pick(otmp) &&
	   (passes_walls(ptr) && thick_skinned(ptr))) tmp += 2;

#ifdef INVISIBLE_OBJECTS
	/* Invisible weapons against monsters who can't see invisible */
	if (otmp->oinvis && !perceives(ptr)) tmp += 3;
#endif

	/* Check specially named weapon "to hit" bonuses */
	if (otmp->oartifact) tmp += spec_abon(otmp, mon);

	return tmp;
}